

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void stable_grail_common_sort(int **arr,int Len,int **extbuf,int LExtBuf)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint K;
  int **ppiVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint K_00;
  int iVar13;
  uint LL;
  long lVar14;
  int iVar15;
  uint local_60;
  
  if (Len < 0x11) {
    stable_bitonic_sort(arr,(long)Len);
    return;
  }
  uVar4 = 1;
  do {
    K_00 = uVar4;
    uVar4 = K_00 * 2;
  } while ((int)(K_00 * K_00) < Len);
  iVar13 = (Len + -1) / (int)K_00;
  local_60 = iVar13 + K_00 + 1;
  if ((int)local_60 < 2) {
    iVar15 = 1;
    stable_grail_rotate(arr,0,1);
  }
  else {
    iVar9 = 0;
    iVar15 = 1;
    uVar10 = 1;
    do {
      iVar8 = iVar15;
      if (iVar15 < 1) {
LAB_0010a2a8:
        stable_grail_rotate(arr + iVar9,iVar15,(int)uVar10 - (iVar9 + iVar15));
        iVar9 = (int)uVar10 - iVar15;
        stable_grail_rotate(arr + (iVar9 + iVar8),iVar15 - iVar8,1);
        iVar15 = iVar15 + 1;
      }
      else {
        iVar7 = -1;
        iVar6 = iVar15;
        do {
          iVar11 = (iVar6 - iVar7 >> 1) + iVar7;
          if (*arr[uVar10] <= *(arr + iVar9)[iVar11]) {
            iVar6 = iVar11;
            iVar11 = iVar7;
          }
          iVar7 = iVar11;
        } while (iVar7 < iVar6 + -1);
        if ((iVar6 == iVar15) || (iVar8 = iVar6, *arr[uVar10] != *arr[iVar6 + iVar9]))
        goto LAB_0010a2a8;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar10 < (uint)Len) && (iVar15 < (int)local_60));
    stable_grail_rotate(arr,iVar9,iVar15);
    if (iVar15 < (int)local_60) {
      if (iVar15 < 4) {
        uVar10 = 1;
        do {
          piVar1 = arr[uVar10 - 1];
          if (*arr[uVar10] < *piVar1) {
            arr[uVar10 - 1] = arr[uVar10];
            arr[uVar10] = piVar1;
          }
          uVar10 = uVar10 + 2;
        } while (uVar10 < (uint)Len);
        iVar13 = 2;
        do {
          iVar15 = iVar13 * 2;
          uVar4 = Len + iVar13 * -2;
          lVar14 = 0;
          if (-1 < (int)uVar4) {
            lVar14 = 0;
            ppiVar5 = arr;
            do {
              stable_grail_merge_without_buffer(ppiVar5,iVar13,iVar13);
              lVar14 = lVar14 + iVar15;
              ppiVar5 = ppiVar5 + iVar15;
            } while (lVar14 <= (long)(ulong)uVar4);
          }
          iVar9 = Len - (int)lVar14;
          iVar8 = iVar9 - iVar13;
          if (iVar8 != 0 && iVar13 <= iVar9) {
            stable_grail_merge_without_buffer(arr + (int)lVar14,iVar13,iVar8);
          }
          iVar13 = iVar15;
        } while (iVar15 < Len);
        return;
      }
      do {
        K = K_00;
        K_00 = K >> 1;
      } while (iVar15 < (int)K);
      iVar13 = Len - K;
      K_00 = 0;
      stable_grail_build_blocks(arr + (int)K,iVar13,K,(int **)0x0,0);
      uVar4 = K * 2;
      bVar2 = true;
      local_60 = K;
      uVar3 = K;
      goto LAB_0010a42b;
    }
  }
  K = iVar13 + 1;
  iVar13 = Len - local_60;
  stable_grail_build_blocks(arr + (int)local_60,iVar13,K_00,extbuf,LExtBuf);
  bVar2 = false;
  uVar3 = K_00;
LAB_0010a42b:
  if ((int)uVar4 < iVar13) {
    do {
      LL = uVar4;
      uVar4 = K_00;
      if ((bVar2) && (((int)K < 5 || (uVar4 = K >> 1, (int)((K >> 3) * K) < (int)LL)))) {
        iVar9 = 1;
        if ((1 < (int)K) && ((long)(int)LL * (long)iVar15 != 0)) {
          lVar14 = (long)(int)LL * (long)iVar15 >> 1;
          do {
            iVar9 = iVar9 * 2;
            lVar12 = lVar14 + 7;
            if (-1 < lVar14) {
              lVar12 = lVar14;
            }
          } while ((iVar9 < (int)K) &&
                  (uVar10 = lVar14 - 8, lVar14 = lVar12 >> 3, uVar10 < 0xfffffffffffffff1));
        }
        uVar4 = (int)(uVar3 << 2) / iVar9;
        ppiVar5 = (int **)0x0;
        iVar9 = 0;
      }
      else {
        ppiVar5 = extbuf;
        if (LExtBuf < (int)uVar4) {
          ppiVar5 = (int **)0x0;
        }
        iVar9 = 1;
      }
      stable_grail_combine_blocks(arr,arr + (int)local_60,iVar13,LL,uVar4,iVar9,ppiVar5);
      uVar4 = LL * 2;
      uVar3 = LL;
    } while ((int)(LL * 2) < iVar13);
  }
  stable_bitonic_sort(arr,(long)(int)local_60);
  stable_grail_merge_without_buffer(arr,local_60,iVar13);
  return;
}

Assistant:

static void GRAIL_COMMON_SORT(SORT_TYPE *arr, int Len, SORT_TYPE *extbuf,
                              int LExtBuf) {
  int lblock, nkeys, findkeys, ptr, cbuf, lb, nk;
  int havebuf, chavebuf;
  long long s;

  if (Len <= SMALL_SORT_BND) {
    SMALL_SORT(arr, Len);
    return;
  }

  lblock = 1;

  while (lblock * lblock < Len) {
    lblock *= 2;
  }

  nkeys = (Len - 1) / lblock + 1;
  findkeys = GRAIL_FIND_KEYS(arr, Len, nkeys + lblock);
  havebuf = 1;

  if (findkeys < nkeys + lblock) {
    if (findkeys < 4) {
      GRAIL_LAZY_STABLE_SORT(arr, Len);
      return;
    }

    nkeys = lblock;

    while (nkeys > findkeys) {
      nkeys /= 2;
    }

    havebuf = 0;
    lblock = 0;
  }

  ptr = lblock + nkeys;
  cbuf = havebuf ? lblock : nkeys;

  if (havebuf) {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, extbuf, LExtBuf);
  } else {
    GRAIL_BUILD_BLOCKS(arr + ptr, Len - ptr, cbuf, NULL, 0);
  }

  /* 2*cbuf are built */
  while (Len - ptr > (cbuf *= 2)) {
    lb = lblock;
    chavebuf = havebuf;

    if (!havebuf) {
      if (nkeys > 4 && nkeys / 8 * nkeys >= cbuf) {
        lb = nkeys / 2;
        chavebuf = 1;
      } else {
        nk = 1;
        s = (long long)cbuf * findkeys / 2;

        while (nk < nkeys && s != 0) {
          nk *= 2;
          s /= 8;
        }

        lb = (2 * cbuf) / nk;
      }
    }

    GRAIL_COMBINE_BLOCKS(arr, arr + ptr, Len - ptr, cbuf, lb, chavebuf,
                         chavebuf && lb <= LExtBuf ? extbuf : NULL);
  }

  SMALL_SORT(arr, ptr);
  GRAIL_MERGE_WITHOUT_BUFFER(arr, ptr, Len - ptr);
}